

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_MultiGFab.cpp
# Opt level: O0

MultiFab * __thiscall amrex::EB2::MultiGFab::getLevelSet(MultiGFab *this)

{
  bool bVar1;
  int iVar2;
  FabArrayBase *fabarray_;
  GFab *this_00;
  BaseFab<double> *this_01;
  FabArray<amrex::FArrayBox> *in_RSI;
  MFInfo *in_RDI;
  BaseFab<double> *fab;
  MFIter mfi;
  MultiFab *r;
  MFIter *a_mfi;
  LayoutData<amrex::EB2::GFab> *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  FArrayBox *in_stack_fffffffffffffdf0;
  int n;
  BoxArray *in_stack_fffffffffffffdf8;
  BoxArray *bxs;
  FabFactory<amrex::FArrayBox> *factory;
  FArrayBox local_1b0;
  BaseFab<double> *local_168;
  MFIter local_160;
  undefined1 local_f0 [16];
  int aiStack_e0 [8];
  Vector<int,_std::allocator<int>_> *local_c0;
  int local_b8;
  Vector<int,_std::allocator<int>_> *local_b0;
  int local_a8;
  FabFactory<amrex::FArrayBox> local_a0 [13];
  undefined1 local_31;
  Vector<int,_std::allocator<int>_> *local_20;
  int local_18;
  Vector<int,_std::allocator<int>_> *local_c;
  int local_4;
  
  local_31 = 0;
  fabarray_ = (FabArrayBase *)FabArrayBase::boxArray(&in_RSI->super_FabArrayBase);
  IntVect::IntVect((IntVect *)&local_c,1);
  local_18 = local_4;
  local_20 = local_c;
  local_b8 = local_4;
  local_c0 = local_c;
  local_a8 = local_4;
  local_b0 = local_c;
  factory = local_a0;
  convert(in_stack_fffffffffffffdf8,(IntVect *)in_stack_fffffffffffffdf0);
  FabArrayBase::DistributionMap(&in_RSI->super_FabArrayBase);
  aiStack_e0._8_8_ = 0;
  aiStack_e0[4] = 0;
  aiStack_e0[5] = 0;
  local_f0._8_8_ = (FabArrayBase *)0x0;
  aiStack_e0[0] = 0;
  aiStack_e0[1] = 0;
  aiStack_e0[6] = 0;
  aiStack_e0[7] = 0;
  bxs = (BoxArray *)(local_f0 + 8);
  MFInfo::MFInfo((MFInfo *)0x14c9092);
  MFInfo::SetAlloc((MFInfo *)bxs,false);
  local_f0._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  a_mfi = (MFIter *)local_f0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffde0);
  MultiFab::MultiFab((MultiFab *)a_mfi,bxs,(DistributionMapping *)in_RSI,
                     (int)((ulong)fabarray_ >> 0x20),(int)fabarray_,in_RDI,factory);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x14c90fe);
  MFInfo::~MFInfo((MFInfo *)0x14c910b);
  BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffde0);
  MFIter::MFIter((MFIter *)in_RSI,fabarray_,(uchar)((ulong)in_RDI >> 0x38));
  while( true ) {
    n = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
    bVar1 = MFIter::isValid(&local_160);
    if (!bVar1) break;
    this_00 = LayoutData<amrex::EB2::GFab>::operator[](in_stack_fffffffffffffde0,a_mfi);
    this_01 = GFab::getLevelSet(this_00);
    local_168 = this_01;
    in_stack_fffffffffffffde0 = (LayoutData<amrex::EB2::GFab> *)BaseFab<double>::box(this_01);
    iVar2 = BaseFab<double>::nComp(local_168);
    BaseFab<double>::dataPtr(this_01,n);
    in_stack_fffffffffffffdf0 = &local_1b0;
    FArrayBox::FArrayBox
              (in_stack_fffffffffffffdf0,(Box *)CONCAT44(iVar2,in_stack_fffffffffffffde8),
               (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),(Real *)a_mfi);
    FabArray<amrex::FArrayBox>::setFab<amrex::FArrayBox,_0>
              (in_RSI,(MFIter *)fabarray_,(FArrayBox *)in_RDI);
    FArrayBox::~FArrayBox((FArrayBox *)0x14c924a);
    MFIter::operator++(&local_160);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffde0);
  return (MultiFab *)in_RDI;
}

Assistant:

MultiFab
MultiGFab::getLevelSet ()
{
    MultiFab r(amrex::convert(boxArray(),IntVect::TheNodeVector()),
               DistributionMap(), 1, GFab::ng, MFInfo().SetAlloc(false));

    for (MFIter mfi(*this); mfi.isValid(); ++mfi) {
        auto& fab = (*this)[mfi].getLevelSet();
        r.setFab(mfi, FArrayBox(fab.box(), fab.nComp(), fab.dataPtr()));
    }

    return r;
}